

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Floating::WithinRelMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinRelMatcher *this)

{
  ReusableStringStream *pRVar1;
  ReusableStringStream sstr;
  ReusableStringStream RStack_38;
  double local_20;
  
  ReusableStringStream::ReusableStringStream(&RStack_38);
  std::operator<<((ostream *)RStack_38.m_oss,"and ");
  pRVar1 = ReusableStringStream::operator<<(&RStack_38,&this->m_target);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [13])" are within ");
  local_20 = this->m_epsilon * 100.0;
  pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_20);
  ReusableStringStream::operator<<(pRVar1,(char (*) [16])"% of each other");
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinRelMatcher::describe() const {
        Catch::ReusableStringStream sstr;
        sstr << "and " << m_target << " are within " << m_epsilon * 100. << "% of each other";
        return sstr.str();
    }